

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O3

Size_t __thiscall
cppurses::detail::Event_queue::View<(cppurses::Event::Type)10>::Move_iterator::find_next
          (Move_iterator *this,Size_t from)

{
  _Rb_tree_header *p_Var1;
  pthread_mutex_t *__mutex;
  pointer puVar2;
  __uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_> _Var3;
  Widget *pWVar4;
  int iVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  Size_t SVar8;
  Size_t SVar9;
  Widget *local_30;
  
  __mutex = (pthread_mutex_t *)this->mtx_;
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  SVar8 = (long)(this->events_->
                super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->events_->
                super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 3;
  if ((SVar8 != from) && (SVar9 = from + 1, from = SVar8, SVar9 != SVar8)) {
    p_Var1 = &(this->already_sent_)._M_t._M_impl.super__Rb_tree_header;
    do {
      puVar2 = (this->events_->
               super__Vector_base<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      _Var3._M_t.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
      super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl =
           puVar2[SVar9]._M_t.
           super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>._M_t;
      if ((_Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
          _Var3._M_t.
          super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
          super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl != (Event *)0x0) {
        pWVar4 = *(Widget **)
                  ((long)_Var3._M_t.
                         super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
                         .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl + 0x10);
        p_Var6 = (this->already_sent_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var1->_M_header;
        if (p_Var6 != (_Base_ptr)0x0) {
          do {
            if (*(Widget **)(p_Var6 + 1) >= pWVar4) {
              p_Var7 = p_Var6;
            }
            p_Var6 = (&p_Var6->_M_left)[*(Widget **)(p_Var6 + 1) < pWVar4];
          } while (p_Var6 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
             ((Widget *)((_Rb_tree_header *)p_Var7)->_M_node_count <= pWVar4)) {
            puVar2[SVar9]._M_t.
            super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>._M_t =
                 (tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_>)0x0;
            (**(code **)(*(long *)_Var3._M_t.
                                  super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
                                  .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl + 8)
            )();
            goto LAB_0014b22a;
          }
        }
        local_30 = pWVar4;
        std::
        _Rb_tree<cppurses::Widget*,cppurses::Widget*,std::_Identity<cppurses::Widget*>,std::less<cppurses::Widget*>,std::allocator<cppurses::Widget*>>
        ::_M_insert_unique<cppurses::Widget*>
                  ((_Rb_tree<cppurses::Widget*,cppurses::Widget*,std::_Identity<cppurses::Widget*>,std::less<cppurses::Widget*>,std::allocator<cppurses::Widget*>>
                    *)&this->already_sent_,&local_30);
        from = SVar9;
        break;
      }
LAB_0014b22a:
      SVar9 = SVar9 + 1;
    } while (SVar9 != SVar8);
  }
  pthread_mutex_unlock(__mutex);
  return from;
}

Assistant:

inline auto Event_queue::View<Event::Paint>::Move_iterator::find_next(
    Size_t from) -> Size_t
{
    Guard_t g{mtx_};
    const auto end = events_.size();
    if (from == end)
        return from;
    while (++from != end) {
        if (events_[from] == nullptr)
            continue;
        if (already_sent_.count(&(events_[from]->receiver())) > 0) {
            events_[from].reset(nullptr);
            continue;
        }
        already_sent_.insert(&(events_[from]->receiver()));
        break;
    }
    return from;
}